

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireEmptyHandTest_tryAddCardOnFoundationPile_Test::TestBody
          (SolitaireEmptyHandTest_tryAddCardOnFoundationPile_Test *this)

{
  PileId *this_00;
  FoundationPileMock *this_01;
  bool bVar1;
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  *this_02;
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  *this_03;
  MockSpec<void_(std::optional<solitaire::cards::Card>_&)> *this_04;
  TypedExpectation<void_(std::optional<solitaire::cards::Card>_&)> *this_05;
  Solitaire *this_06;
  Cards *this_07;
  char *message;
  FoundationPileMock *in_RSI;
  char *in_R9;
  string local_c0;
  AssertHelper local_a0;
  Message local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  WithoutMatchers local_6d [13];
  Matcher<std::optional<solitaire::cards::Card>_&> local_60;
  MockSpec<void_(std::optional<solitaire::cards::Card>_&)> local_48;
  WithoutMatchers local_21;
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  local_20;
  SolitaireEmptyHandTest_tryAddCardOnFoundationPile_Test *local_10;
  SolitaireEmptyHandTest_tryAddCardOnFoundationPile_Test *this_local;
  
  local_10 = this;
  local_20.function_mocker_ =
       (FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
        *)piles::FoundationPileMock::gmock_createSnapshot
                    ((MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
                      *)(this->super_SolitaireEmptyHandTest).super_SolitaireTest.
                        lastFoundationPileMock,in_RSI);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
            ::operator()(&local_20,&local_21,(void *)0x0);
  this_03 = testing::internal::
            MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
            ::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x113,"lastFoundationPileMock","createSnapshot()");
  testing::internal::
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::Times(this_03,0);
  this_01 = (this->super_SolitaireEmptyHandTest).super_SolitaireTest.lastFoundationPileMock;
  testing::Matcher<std::optional<solitaire::cards::Card>&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<std::optional<solitaire::cards::Card>&> *)&local_60,
             (AnythingMatcher *)&testing::_);
  piles::FoundationPileMock::gmock_tryAddCard(&local_48,this_01,&local_60);
  testing::internal::GetWithoutMatchers();
  this_04 = testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::operator()
                      (&local_48,local_6d,(void *)0x0);
  this_05 = testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::
            InternalExpectedAt(this_04,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                               ,0x114,"lastFoundationPileMock","tryAddCard(_)");
  testing::internal::TypedExpectation<void_(std::optional<solitaire::cards::Card>_&)>::Times
            (this_05,0);
  testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::~MockSpec(&local_48);
  testing::Matcher<std::optional<solitaire::cards::Card>_&>::~Matcher(&local_60);
  this_06 = &(this->super_SolitaireEmptyHandTest).super_SolitaireTest.solitaire;
  this_00 = (PileId *)
            ((long)&gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 4);
  piles::PileId::PileId(this_00,(PileId *)&(anonymous_namespace)::lastFoundationPileId);
  Solitaire::tryAddCardOnFoundationPile(this_06,this_00);
  this_07 = Solitaire::getCardsInHand(this_06);
  local_89 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::empty
                       (this_07);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,(internal *)local_88,
               (AssertionResult *)"solitaire.getCardsInHand().empty()","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x117,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, tryAddCardOnFoundationPile) {
    EXPECT_CALL(lastFoundationPileMock, createSnapshot()).Times(0);
    EXPECT_CALL(lastFoundationPileMock, tryAddCard(_)).Times(0);

    solitaire.tryAddCardOnFoundationPile(lastFoundationPileId);
    EXPECT_TRUE(solitaire.getCardsInHand().empty());
}